

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.hpp
# Opt level: O0

void __thiscall
LoaderLogRecorder::LoaderLogRecorder
          (LoaderLogRecorder *this,XrLoaderLogType type,void *user_data,
          XrLoaderLogMessageSeverityFlags message_severities,
          XrLoaderLogMessageTypeFlags message_types)

{
  XrLoaderLogMessageTypeFlags message_types_local;
  XrLoaderLogMessageSeverityFlags message_severities_local;
  void *user_data_local;
  XrLoaderLogType type_local;
  LoaderLogRecorder *this_local;
  
  this->_vptr_LoaderLogRecorder = (_func_int **)&PTR__LoaderLogRecorder_001b19a8;
  this->_active = false;
  this->_user_data = user_data;
  this->_type = type;
  this->_unique_id = 0;
  this->_message_severities = message_severities;
  this->_message_types = message_types;
  return;
}

Assistant:

LoaderLogRecorder(XrLoaderLogType type, void* user_data, XrLoaderLogMessageSeverityFlags message_severities,
                      XrLoaderLogMessageTypeFlags message_types) {
        _active = false;
        _user_data = user_data;
        _type = type;
        _unique_id = 0;
        _message_severities = message_severities;
        _message_types = message_types;
    }